

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_floor(lua_State *L)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [64];
  lua_Number d;
  lua_State *L_local;
  undefined1 extraout_var [56];
  
  iVar2 = lua_isinteger(L,1);
  if (iVar2 == 0) {
    auVar3._0_8_ = luaL_checknumber(L,1);
    auVar3._8_56_ = extraout_var;
    auVar1 = vroundsd_avx(auVar3._0_16_,auVar3._0_16_,9);
    pushnumint(L,auVar1._0_8_);
  }
  else {
    lua_settop(L,1);
  }
  return 1;
}

Assistant:

static int math_floor (lua_State *L) {
  if (lua_isinteger(L, 1))
    lua_settop(L, 1);  /* integer is its own floor */
  else {
    lua_Number d = l_mathop(floor)(luaL_checknumber(L, 1));
    pushnumint(L, d);
  }
  return 1;
}